

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O2

DdNode * cuddCacheLookup1Zdd(DdManager *table,DD_CTFP1 op,DdNode *f)

{
  uint uVar1;
  DdNode *pDVar2;
  DdCache *pDVar3;
  double dVar4;
  
  uVar1 = ((int)op * 0xc00005 +
          (((uint)f & 1) + *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00006) *
          0x40f1f9 >> ((byte)table->cacheShift & 0x1f);
  pDVar2 = table->cache[(int)uVar1].data;
  if (((pDVar2 == (DdNode *)0x0) || (pDVar3 = table->cache + (int)uVar1, pDVar3->f != f)) ||
     ((DD_CTFP1)pDVar3->h != op)) {
    dVar4 = table->cacheMisses + 1.0;
    table->cacheMisses = dVar4;
    if ((-1 < table->cacheSlack) && (dVar4 * table->minHit < table->cacheHits)) {
      cuddCacheResize(table);
    }
    pDVar2 = (DdNode *)0x0;
  }
  else {
    table->cacheHits = table->cacheHits + 1.0;
    if (((DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe))->ref == 0) {
      cuddReclaimZdd(table,(DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe));
      pDVar2 = pDVar3->data;
    }
  }
  return pDVar2;
}

Assistant:

DdNode *
cuddCacheLookup1Zdd(
  DdManager * table,
  DD_CTFP1 op,
  DdNode * f)
{
    int posn;
    DdCache *en,*cache;
    DdNode *data;

    cache = table->cache;
#ifdef DD_DEBUG
    if (cache == NULL) {
        return(NULL);
    }
#endif

    posn = ddCHash2(op,cuddF2L(f),cuddF2L(f),table->cacheShift);
    en = &cache[posn];
    if (en->data != NULL && en->f==f && en->h==(ptruint)op) {
        data = Cudd_Regular(en->data);
        table->cacheHits++;
        if (data->ref == 0) {
            cuddReclaimZdd(table,data);
        }
        return(en->data);
    }

    /* Cache miss: decide whether to resize. */
    table->cacheMisses++;

    if (table->cacheSlack >= 0  &&
        table->cacheHits > table->cacheMisses * table->minHit) {
        cuddCacheResize(table);
    }

    return(NULL);

}